

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O1

sexp_conflict sexp_free_sizes(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_heap_conflict psVar1;
  long lVar2;
  sexp_free_list_conflict psVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  sexp_conflict res;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  size_t freed;
  sexp_uint_t sizes [512];
  sexp_conflict local_1058;
  sexp_conflict local_1050;
  sexp_gc_var_t local_1048;
  sexp_gc_var_t local_1038 [2];
  long local_1018 [513];
  
  psVar1 = (ctx->value).context.heap;
  local_1058 = (sexp_conflict)0x43e;
  local_1048.var = (sexp_conflict *)0x0;
  local_1048.next = (sexp_gc_var_t *)0x0;
  local_1050 = (sexp_conflict)0x43e;
  local_1038[0].var = (sexp_conflict *)0x0;
  local_1038[0].next = (sexp_gc_var_t *)0x0;
  sexp_gc();
  memset(local_1018,0,0x1000);
  for (; psVar1 != (sexp_heap_conflict)0x0; psVar1 = psVar1->next) {
    for (psVar3 = psVar1->free_list; psVar3 != (sexp_free_list_conflict)0x0; psVar3 = psVar3->next)
    {
      uVar4 = psVar3->size + 0x1f;
      uVar5 = uVar4 >> 5;
      if (0x3fff < uVar4) {
        uVar5 = 0x1ff;
      }
      local_1018[uVar5] = local_1018[uVar5] + 1;
    }
  }
  local_1038[0].next = &local_1048;
  local_1048.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_1038[0].next;
  local_1038[0].var = &local_1050;
  (ctx->value).context.saves = local_1038;
  local_1058 = (sexp_conflict)0x23e;
  lVar6 = 0x3fe;
  local_1048.var = &local_1058;
  do {
    lVar2 = *(long *)((long)local_1018 + lVar6 * 4);
    if (lVar2 != 0) {
      local_1050 = (sexp_conflict)sexp_cons_op(ctx,0,2,lVar6 + 1,lVar2 * 2 + 1);
      local_1058 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_1050,local_1058);
    }
    lVar6 = lVar6 + -2;
  } while (lVar6 != -2);
  (ctx->value).context.saves = local_1048.next;
  return local_1058;
}

Assistant:

static sexp sexp_free_sizes (sexp ctx, sexp self, sexp_sint_t n) {
  size_t freed;
  sexp_uint_t sizes[512];
  sexp_sint_t i;
  sexp_heap h = sexp_context_heap(ctx);
  sexp_free_list q;
  sexp_gc_var2(res, tmp);

  /* run gc once to remove unused variables */
  sexp_gc(ctx, &freed);

  /* initialize stats */
  for (i=0; i<512; i++)
    sizes[i]=0;

  /* loop over each free block */
  for ( ; h; h=h->next)
    for (q=h->free_list; q; q=q->next)
      sizes[sexp_heap_chunks(q->size) > 511 ? 511 : sexp_heap_chunks(q->size)]++;

  /* build and return results */
  sexp_gc_preserve2(ctx, res, tmp);
  res = SEXP_NULL;
  for (i=511; i>=0; i--)
    if (sizes[i]) {
      tmp = sexp_cons(ctx, sexp_make_fixnum(i), sexp_make_fixnum(sizes[i]));
      res = sexp_cons(ctx, tmp, res);
    }
  sexp_gc_release2(ctx);
  return res;
}